

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O3

string * __thiscall
sciplot::gnuplot::sizestr_abi_cxx11_
          (string *__return_storage_ptr__,gnuplot *this,size_t width,size_t height,bool asinches)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  string local_98;
  string local_78;
  string local_58;
  size_t local_38;
  gnuplot *local_30;
  double local_28;
  double local_20;
  
  local_38 = width;
  local_30 = this;
  if ((int)height == 0) {
    internal::str<unsigned_long>(&local_98,(unsigned_long *)&local_30);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
    puVar5 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar5) {
      local_a8 = *puVar5;
      uStack_a0 = puVar4[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *puVar5;
      local_b8 = (ulong *)*puVar4;
    }
    local_b0 = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    internal::str<unsigned_long>(&local_78,&local_38);
    uVar7 = 0xf;
    if (local_b8 != &local_a8) {
      uVar7 = local_a8;
    }
    if (uVar7 < local_78._M_string_length + local_b0) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar8 = local_78.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_78._M_string_length + local_b0) goto LAB_001714f1;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_b8);
    }
    else {
LAB_001714f1:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78._M_dataplus._M_p);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = puVar4 + 2;
    if ((size_type *)*puVar4 == psVar6) {
      uVar8 = puVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = puVar4[1];
    *puVar4 = psVar6;
    puVar4[1] = 0;
    *(undefined1 *)psVar6 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    local_78.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    local_78._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001716a2;
  }
  auVar9._8_4_ = (int)((ulong)this >> 0x20);
  auVar9._0_8_ = this;
  auVar9._12_4_ = 0x45300000;
  local_20 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0)) * 0.013888888888888888;
  internal::str<double>(&local_78,&local_20);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  paVar1 = &local_98.field_2;
  puVar5 = (ulong *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5) {
    local_98.field_2._M_allocated_capacity = *puVar5;
    local_98.field_2._8_8_ = plVar3[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *puVar5;
    local_98._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_98._M_string_length = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  auVar10._8_4_ = (int)(width >> 0x20);
  auVar10._0_8_ = width;
  auVar10._12_4_ = 0x45300000;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_28 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)width) - 4503599627370496.0)) * 0.013888888888888888;
  internal::str<double>(&local_58,&local_28);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    uVar8 = local_98.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_58._M_string_length + local_98._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar8 = local_58.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_58._M_string_length + local_98._M_string_length) goto LAB_00171467;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_58,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
  }
  else {
LAB_00171467:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_58._M_dataplus._M_p);
  }
  local_b8 = &local_a8;
  puVar5 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar5) {
    local_a8 = *puVar5;
    uStack_a0 = puVar4[3];
  }
  else {
    local_a8 = *puVar5;
    local_b8 = (ulong *)*puVar4;
  }
  local_b0 = puVar4[1];
  *puVar4 = puVar5;
  puVar4[1] = 0;
  *(undefined1 *)puVar5 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == &local_78.field_2) {
    return __return_storage_ptr__;
  }
LAB_001716a2:
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

inline auto sizestr(std::size_t width, std::size_t height, bool asinches) -> std::string
{
    return asinches ? (internal::str(width * POINT_TO_INCHES) + "in," + internal::str(height * POINT_TO_INCHES) + "in") : (internal::str(width) + "," + internal::str(height));
}